

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O3

void __thiscall
Iir::Butterworth::LowPassBase::setup(LowPassBase *this,int order,double cutoffFrequency)

{
  AnalogLowPass *this_00;
  LayoutBase *digital;
  LowPassTransform local_20;
  
  this_00 = &(this->super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>).m_analogProto;
  AnalogLowPass::design(this_00,order);
  digital = &(this->super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>).super_PoleFilterBase2.
             m_digitalProto;
  LowPassTransform::LowPassTransform(&local_20,cutoffFrequency,digital,&this_00->super_LayoutBase);
  Cascade::setLayout((Cascade *)this,digital);
  return;
}

Assistant:

void LowPassBase::setup (int order,
                         double cutoffFrequency)
{
  m_analogProto.design (order);

  LowPassTransform (cutoffFrequency,
                    m_digitalProto,
                    m_analogProto);

  Cascade::setLayout (m_digitalProto);
}